

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.h
# Opt level: O3

void __thiscall
Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Graph
          (Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,int vertices)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  ulong *puVar4;
  GraphVertex<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pGVar5;
  long lVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  uVar7 = (ulong)vertices;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar7;
  uVar2 = SUB168(auVar1 * ZEXT816(0x18),0);
  uVar3 = uVar2 + 8;
  if (0xfffffffffffffff7 < uVar2) {
    uVar3 = 0xffffffffffffffff;
  }
  this->vertexCount = vertices;
  if (SUB168(auVar1 * ZEXT816(0x18),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  puVar4 = (ulong *)operator_new__(uVar3);
  *puVar4 = uVar7;
  if (vertices != 0) {
    lVar6 = 0;
    do {
      *(undefined1 (*) [16])
       ((long)&((SinglyLinkedList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(puVar4 + 1))->head + lVar6) = (undefined1  [16])0x0;
      *(undefined4 *)((long)puVar4 + lVar6 + 0x18) = 0;
      lVar6 = lVar6 + 0x18;
    } while (uVar7 * 0x18 != lVar6);
  }
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar7;
  uVar2 = SUB168(auVar10 * ZEXT816(0x48),0);
  uVar3 = uVar2 + 8;
  if (0xfffffffffffffff7 < uVar2) {
    uVar3 = 0xffffffffffffffff;
  }
  this->adjacencyList =
       (SinglyLinkedList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)(puVar4 + 1);
  uVar2 = 0xffffffffffffffff;
  if (SUB168(auVar10 * ZEXT816(0x48),8) == 0) {
    uVar2 = uVar3;
  }
  puVar4 = (ulong *)operator_new__(uVar2);
  pGVar5 = (GraphVertex<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)(puVar4 + 1);
  *puVar4 = uVar7;
  if (vertices == 0) {
    this->vertexList = pGVar5;
  }
  else {
    puVar4 = puVar4 + 4;
    lVar6 = uVar7 * 0x48;
    do {
      puVar4[-2] = (ulong)puVar4;
      puVar4[-1] = 0;
      *(undefined1 *)puVar4 = 0;
      puVar4[2] = (ulong)(puVar4 + 4);
      puVar4[3] = 0;
      *(undefined1 *)(puVar4 + 4) = 0;
      puVar4 = puVar4 + 9;
      lVar6 = lVar6 + -0x48;
    } while (lVar6 != 0);
    this->vertexList = pGVar5;
    auVar1 = _DAT_0011d430;
    if (0 < vertices) {
      lVar6 = (ulong)(uint)vertices - 1;
      auVar8._8_4_ = (int)lVar6;
      auVar8._0_8_ = lVar6;
      auVar8._12_4_ = (int)((ulong)lVar6 >> 0x20);
      uVar2 = 0;
      auVar8 = auVar8 ^ _DAT_0011d430;
      auVar9 = _DAT_0011d420;
      do {
        auVar10 = auVar9 ^ auVar1;
        if ((bool)(~(auVar10._4_4_ == auVar8._4_4_ && auVar8._0_4_ < auVar10._0_4_ ||
                    auVar8._4_4_ < auVar10._4_4_) & 1)) {
          pGVar5->index = (int)uVar2;
        }
        if ((auVar10._12_4_ != auVar8._12_4_ || auVar10._8_4_ <= auVar8._8_4_) &&
            auVar10._12_4_ <= auVar8._12_4_) {
          pGVar5[1].index = (int)uVar2 + 1;
        }
        uVar2 = uVar2 + 2;
        lVar6 = auVar9._8_8_;
        auVar9._0_8_ = auVar9._0_8_ + 2;
        auVar9._8_8_ = lVar6 + 2;
        pGVar5 = pGVar5 + 2;
      } while ((vertices + 1U & 0xfffffffe) != uVar2);
    }
  }
  return;
}

Assistant:

Graph<T>::Graph(int vertices)
{
  vertexCount = vertices;
  //we need to allocate the memory for the two arrays
  adjacencyList = new SinglyLinkedList<T>[vertices];
  vertexList = new GraphVertex<T>[vertices];

  for(int i = 0; i<vertexCount; i++)
  {
    //set the index of each vertex in the list to i
    vertexList[i].setIndex(i);
  }
}